

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

pair<int,_int> __thiscall Board::eliminate(Board *this,Block *block)

{
  byte bVar1;
  long in_RSI;
  long in_RDI;
  int j_1;
  int j;
  int i_2;
  int i_1;
  int *shape;
  int count2;
  int i;
  int count;
  int *in_stack_ffffffffffffffa8;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_20;
  int local_1c;
  pair<int,_int> local_8;
  
  local_1c = 0;
  local_20 = 1;
  while ((local_20 < 0x15 && (*(int *)(in_RDI + (long)local_20 * 4) != 0x801))) {
    if (*(int *)(in_RDI + (long)local_20 * 4) == 0xfff) {
      local_1c = local_1c + 1;
    }
    local_20 = local_20 + 1;
  }
  if (local_1c == 0) {
    local_8 = std::make_pair<int,int>(in_stack_ffffffffffffffa8,(int *)0x142329);
  }
  else {
    if (in_RSI != 0) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
      }
    }
    for (local_40 = 0x14; 0 < local_40; local_40 = local_40 + -1) {
      if (*(int *)(in_RDI + (long)local_40 * 4) == 0xfff) {
        for (local_44 = local_40; local_44 < 0x14; local_44 = local_44 + 1) {
          *(undefined4 *)(in_RDI + (long)local_44 * 4) =
               *(undefined4 *)(in_RDI + (long)(local_44 + 1) * 4);
        }
        *(undefined4 *)(in_RDI + 0x50) = 0x801;
        for (local_48 = 1; local_48 < 0xb; local_48 = local_48 + 1) {
          bVar1 = (byte)local_40;
          *(uint *)(in_RDI + 0x58 + (long)local_48 * 4) =
               *(uint *)(in_RDI + 0x58 + (long)local_48 * 4) & (1 << (bVar1 + 1 & 0x1f)) - 1U |
               (*(int *)(in_RDI + 0x58 + (long)local_48 * 4) >> (bVar1 + 1 & 0x1f)) <<
               (bVar1 & 0x1f);
        }
      }
    }
    local_8 = std::make_pair<int&,int&>(in_stack_ffffffffffffffa8,(int *)0x1424ba);
  }
  return local_8;
}

Assistant:

std::pair<int, int> Board::eliminate(const Block *block){
    int count = 0;
    for (int i = 1; i <= MAPHEIGHT; ++i) 
        if (rows[i] == EMPTY_ROW) break;
            else if (rows[i] == FULL_ROW)
                ++count;

    if (count == 0)
        return std::make_pair(0, 0);
    int count2 = 0;
    if (block) {
        auto shape = blockShape[block->t][block->o];
        for (int i = 0; i < 4; ++i)
            if (rows[block->x + shape[2 * i]] == FULL_ROW)
                ++count2;
    }

    for (int i = MAPHEIGHT; i > 0; --i)
        if (rows[i] == FULL_ROW){
            for (int j = i; j < MAPHEIGHT; ++j)
                rows[j] = rows[j + 1];
            rows[MAPHEIGHT] = EMPTY_ROW;
            for (int j = 1; j <= MAPWIDTH; ++j)
                cols[j] = (cols[j] & ((1 << (i + 1)) - 1)) |
                          ((cols[j] >> (i + 1)) << i);
        }
     
    return std::make_pair(count, count2);
}